

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
NormalMutexTest_TryLock_Test<yamc::checked::timed_mutex>::TestBody
          (NormalMutexTest_TryLock_Test<yamc::checked::timed_mutex> *this)

{
  bool bVar1;
  char *message;
  size_t *in_RCX;
  anon_class_16_2_e823ffd4_for_f f;
  AssertHelper local_c0;
  Message local_b8;
  uint local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  undefined1 local_78 [8];
  size_t counter;
  TypeParam mtx;
  NormalMutexTest_TryLock_Test<yamc::checked::timed_mutex> *this_local;
  
  mtx.super_mutex_base.mtx_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)this;
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&counter);
  local_78 = (undefined1  [8])0x0;
  f.counter = in_RCX;
  f.mtx = (TypeParam *)local_78;
  yamc::test::
  task_runner<NormalMutexTest_TryLock_Test<yamc::checked::timed_mutex>::TestBody()::_lambda(unsigned_long)_1_>
            ((test *)0x8,(size_t)&counter,f);
  local_ac = 80000;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a8,"10000u * 8","counter",&local_ac,(unsigned_long *)local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,99,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&counter);
  return;
}

Assistant:

TYPED_TEST(NormalMutexTest, TryLock)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock()) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
        std::this_thread::yield();  // provoke lock contention
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}